

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  byte bVar5;
  undefined1 auVar6 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  uint uVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  ulong uVar12;
  char *pcVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined8 local_58;
  char *local_50;
  bool *local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  ulong local_38;
  
  local_48 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar14 = 0;
      do {
        uVar9 = uVar14;
        if (psVar2 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar2[uVar14];
        }
        uVar12 = uVar14;
        if (psVar3 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar3[uVar14];
        }
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar9].value.pointer.ptr;
        local_58 = *(idx_t *)&rdata[uVar12].value;
        local_50 = rdata[uVar12].value.pointer.ptr;
        uVar8 = (uint)local_58;
        uVar15 = (uint)*(undefined8 *)&ldata[uVar9].value;
        if (uVar15 < uVar8) {
LAB_011353f0:
          bVar17 = false;
        }
        else {
          uVar9 = local_58 & 0xffffffff;
          if (uVar8 < 5) {
            if (uVar9 == 0) {
              bVar17 = true;
            }
            else {
              lVar16 = 0;
              do {
                bVar17 = local_68[lVar16 + 4] == *(char *)((long)&local_58 + lVar16 + 4);
                if (!bVar17) break;
                bVar18 = uVar9 - 1 != lVar16;
                lVar16 = lVar16 + 1;
              } while (bVar18);
            }
          }
          else {
            lVar16 = 0;
            do {
              if (local_68[lVar16 + 4] != *(char *)((long)&local_58 + lVar16 + 4))
              goto LAB_011353f0;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            if (uVar15 < 0xd) {
              p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
            }
            if (uVar8 < 0xd) {
              local_50 = (char *)((long)&local_58 + 4);
            }
            lVar16 = 0;
            do {
              bVar17 = *(char *)((long)p_Stack_60 + lVar16 + 4) == local_50[lVar16 + 4];
              if (!bVar17) break;
              bVar18 = uVar9 - 5 != lVar16;
              lVar16 = lVar16 + 1;
            } while (bVar18);
          }
        }
        result_data[uVar14] = bVar17;
        uVar14 = uVar14 + 1;
      } while (uVar14 != count);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar14 = 0;
    local_38 = count;
    do {
      uVar9 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar14];
      }
      uVar12 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar3[uVar14];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) &&
         ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)))) {
        local_68 = *(undefined1 (*) [8])&ldata[uVar9].value;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar9].value.pointer.ptr;
        local_58 = *(idx_t *)&rdata[uVar12].value;
        local_50 = rdata[uVar12].value.pointer.ptr;
        uVar8 = (uint)local_58;
        if (SUB84(local_68,0) < uVar8) {
LAB_0113553d:
          bVar17 = false;
        }
        else {
          uVar9 = local_58 & 0xffffffff;
          if (uVar8 < 5) {
            if (uVar9 == 0) {
              bVar17 = true;
            }
            else {
              lVar16 = 0;
              do {
                bVar17 = local_68[lVar16 + 4] == *(char *)((long)&local_58 + lVar16 + 4);
                if (!bVar17) break;
                bVar18 = uVar9 - 1 != lVar16;
                lVar16 = lVar16 + 1;
              } while (bVar18);
            }
          }
          else {
            lVar16 = 0;
            do {
              if (local_68[lVar16 + 4] != *(char *)((long)&local_58 + lVar16 + 4))
              goto LAB_0113553d;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            p_Var11 = p_Stack_60;
            if (SUB84(local_68,0) < 0xd) {
              p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
            }
            pcVar13 = local_50;
            if (uVar8 < 0xd) {
              pcVar13 = (char *)((long)&local_58 + 4);
            }
            lVar16 = 0;
            do {
              bVar17 = *(char *)((long)&p_Var11->_vptr__Sp_counted_base + lVar16 + 4) ==
                       pcVar13[lVar16 + 4];
              if (!bVar17) break;
              bVar18 = uVar9 - 5 != lVar16;
              lVar16 = lVar16 + 1;
            } while (bVar18);
          }
        }
        local_48[uVar14] = bVar17;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_68,&local_58);
          p_Var7 = p_Stack_60;
          auVar6 = local_68;
          local_68 = (undefined1  [8])0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var11 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar6;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          }
          if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          count = local_38;
        }
        bVar5 = (byte)uVar14 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar14 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != count);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}